

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

void nn_xrep_init(nn_xrep *self,nn_sockbase_vfptr *vfptr,void *hint)

{
  nn_sockbase_init(&self->sockbase,vfptr,hint);
  nn_random_generate(&self->next_key,4);
  nn_hash_init(&self->outpipes);
  nn_fq_init(&self->inpipes);
  nn_mutex_init(&self->sync);
  return;
}

Assistant:

void nn_xrep_init (struct nn_xrep *self, const struct nn_sockbase_vfptr *vfptr,
    void *hint)
{
    nn_sockbase_init (&self->sockbase, vfptr, hint);

    /*  Start assigning keys beginning with a random number. This way there
        are no key clashes even if the executable is re-started. */
    nn_random_generate (&self->next_key, sizeof (self->next_key));

    nn_hash_init (&self->outpipes);
    nn_fq_init (&self->inpipes);
    nn_mutex_init (&self->sync);
}